

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode ExtensionObject_copy(UA_ExtensionObject *src,UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_ExtensionObjectEncoding UVar1;
  UA_DataType *type;
  UA_StatusCode UVar2;
  UA_StatusCode UVar3;
  uint uVar4;
  
  UVar1 = src->encoding;
  if (UVar1 < UA_EXTENSIONOBJECT_DECODED) {
    dst->encoding = UVar1;
    UVar2 = NodeId_copy(&(src->content).encoded.typeId,&(dst->content).encoded.typeId,_);
    UVar3 = UA_copy((void *)((long)&src->content + 0x18),(void *)((long)&dst->content + 0x18),
                    UA_TYPES + 0xe);
    uVar4 = UVar3 | UVar2;
  }
  else if (UVar1 - UA_EXTENSIONOBJECT_DECODED < 2) {
    uVar4 = 0x80020000;
    if (((src->content).decoded.type != (UA_DataType *)0x0) &&
       ((src->content).decoded.data != (void *)0x0)) {
      dst->encoding = UA_EXTENSIONOBJECT_DECODED;
      type = (src->content).decoded.type;
      (dst->content).decoded.type = type;
      UVar2 = UA_Array_copy((src->content).decoded.data,1,&(dst->content).decoded.data,type);
      return UVar2;
    }
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

static UA_StatusCode
ExtensionObject_copy(UA_ExtensionObject const *src, UA_ExtensionObject *dst,
                     const UA_DataType *_) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(src->encoding) {
    case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
    case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
    case UA_EXTENSIONOBJECT_ENCODED_XML:
        dst->encoding = src->encoding;
        retval = NodeId_copy(&src->content.encoded.typeId,
                             &dst->content.encoded.typeId, NULL);
        retval |= UA_ByteString_copy(&src->content.encoded.body,
                                     &dst->content.encoded.body);
        break;
    case UA_EXTENSIONOBJECT_DECODED:
    case UA_EXTENSIONOBJECT_DECODED_NODELETE:
        if(!src->content.decoded.type || !src->content.decoded.data)
            return UA_STATUSCODE_BADINTERNALERROR;
        dst->encoding = UA_EXTENSIONOBJECT_DECODED;
        dst->content.decoded.type = src->content.decoded.type;
        retval = UA_Array_copy(src->content.decoded.data, 1,
            &dst->content.decoded.data, src->content.decoded.type);
        break;
    default:
        break;
    }
    return retval;
}